

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O3

VarSymbol * __thiscall VarTable::cSearch(VarTable *this,char *lexeme)

{
  int iVar1;
  char *pcVar2;
  char *__s2;
  char *__s2_00;
  char *__s1;
  int iVar3;
  VarSymbol *pVVar4;
  
  if ((lexeme != (char *)0x0) &&
     (pVVar4 = (VarSymbol *)SymbolTable::cSearch(&this->super_SymbolTable,lexeme),
     pVVar4 != (VarSymbol *)0x0)) {
    iVar1 = (this->super_SymbolTable).currentScope;
    pcVar2 = (this->super_SymbolTable).lexemeArray;
    __s2 = (this->super_SymbolTable).currentScopeLexeme;
    __s2_00 = (this->super_SymbolTable).previousScopeLexeme;
    do {
      if (iVar1 < (pVVar4->super_Symbol).scope) {
        return (VarSymbol *)0x0;
      }
      iVar3 = strcmp(pcVar2 + (pVVar4->super_Symbol).lexemeIndex,lexeme);
      __s1 = (pVVar4->super_Symbol).lexemeScope;
      if ((iVar3 == 0) && (iVar3 = strcmp(__s1,__s2), iVar3 == 0)) {
        return pVVar4;
      }
      iVar3 = strcmp(__s1,__s2_00);
      if (iVar3 == 0) {
        return pVVar4;
      }
      iVar3 = strcmp(__s1,"nonLocal");
      if (iVar3 == 0) {
        return pVVar4;
      }
      pVVar4 = (VarSymbol *)(pVVar4->super_Symbol).nextSymbol;
    } while (pVVar4 != (VarSymbol *)0x0);
  }
  return (VarSymbol *)0x0;
}

Assistant:

VarSymbol *VarTable::cSearch(const char *lexeme) {
    if (lexeme != NULL) {
        VarSymbol *varSymbol = (VarSymbol *) SymbolTable::cSearch(lexeme);
        while (varSymbol != NULL && varSymbol->getScope() <= currentScope) {
            if ((!strcmp(lexemeArray + varSymbol->getLexemeIndex(), lexeme) &&
                 varSymbol->isScope(currentScopeLexeme)) ||
                varSymbol->isScope(previousScopeLexeme) || varSymbol->isScope("nonLocal")) {
                return varSymbol;
            }
            varSymbol = (VarSymbol *) varSymbol->getNextSymbol();
        }
    }
    return NULL;
}